

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialRenderer.cpp
# Opt level: O0

bool __thiscall
irr::video::COpenGL3MaterialRenderer::createShader
          (COpenGL3MaterialRenderer *this,GLenum shaderType,char *shader)

{
  Printer *this_00;
  GLenum in_ESI;
  long in_RDI;
  double dVar1;
  GLchar *infoLog;
  GLint length;
  GLint maxLength;
  GLint status;
  GLuint shaderHandle;
  GLsizei local_30;
  GLint local_2c;
  GLint local_28;
  GLuint local_24;
  GLchar *local_20 [4];
  
  if (*(int *)(in_RDI + 0x24) != 0) {
    local_24 = (*GL.CreateShader)(in_ESI);
    (*GL.ShaderSource)(local_24,1,local_20,(GLint *)0x0);
    (*GL.CompileShader)(local_24);
    local_28 = 0;
    dVar1 = (double)(*GL.GetShaderiv)(local_24,0x8b81,&local_28);
    if (local_28 != 1) {
      os::Printer::log((Printer *)"GLSL shader failed to compile",dVar1);
      local_2c = 0;
      (*GL.GetShaderiv)(local_24,0x8b84,&local_2c);
      if (local_2c != 0) {
        this_00 = (Printer *)operator_new__((long)local_2c);
        dVar1 = (double)(*GL.GetShaderInfoLog)(local_24,local_2c,&local_30,(GLchar *)this_00);
        os::Printer::log(this_00,dVar1);
        if (this_00 != (Printer *)0x0) {
          operator_delete__(this_00);
        }
      }
      return false;
    }
    (*GL.AttachShader)(*(GLuint *)(in_RDI + 0x24),local_24);
  }
  return true;
}

Assistant:

bool COpenGL3MaterialRenderer::createShader(GLenum shaderType, const char *shader)
{
	if (Program) {
		GLuint shaderHandle = GL.CreateShader(shaderType);
		GL.ShaderSource(shaderHandle, 1, &shader, NULL);
		GL.CompileShader(shaderHandle);

		GLint status = 0;

		GL.GetShaderiv(shaderHandle, GL_COMPILE_STATUS, &status);

		if (status != GL_TRUE) {
			os::Printer::log("GLSL shader failed to compile", ELL_ERROR);

			GLint maxLength = 0;
			GLint length;

			GL.GetShaderiv(shaderHandle, GL_INFO_LOG_LENGTH,
					&maxLength);

			if (maxLength) {
				GLchar *infoLog = new GLchar[maxLength];
				GL.GetShaderInfoLog(shaderHandle, maxLength, &length, infoLog);
				os::Printer::log(reinterpret_cast<const c8 *>(infoLog), ELL_ERROR);
				delete[] infoLog;
			}

			return false;
		}

		GL.AttachShader(Program, shaderHandle);
	}

	return true;
}